

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

void __thiscall Tokenizer::resetLookaheadCheckMarks(Tokenizer *this)

{
  _Self __tmp;
  Tokenizer *pTVar1;
  
  pTVar1 = (Tokenizer *)(this->position).it._M_node;
  while ((pTVar1 != this && (*(char *)((long)&(pTVar1->invalidToken).line + 4) == '\x01'))) {
    *(undefined1 *)((long)&(pTVar1->invalidToken).line + 4) = 0;
    pTVar1 = (Tokenizer *)
             (pTVar1->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
             super__List_node_base._M_next;
  }
  return;
}

Assistant:

void Tokenizer::resetLookaheadCheckMarks()
{
	auto it = position.it;
	while (it != tokens.end() && it->checked)
	{
		it->checked = false;
		it++;
	}
}